

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool File::isExecutable(String *file)

{
  int iVar1;
  char *__file;
  stat buf;
  stat sStack_98;
  
  __file = String::operator_cast_to_char_(file);
  iVar1 = stat(__file,&sStack_98);
  return (sStack_98.st_mode & 0x49) != 0 && iVar1 == 0;
}

Assistant:

bool File::isExecutable(const String& file)
{
#ifdef _WIN32
  String extension = File::getExtension(file).toLowerCase();
  return extension == "exe" || extension == "com" || extension == "bat";
#else
  struct stat buf;
  if(stat(file, &buf) != 0)
    return false;
  return (buf.st_mode & (S_IXUSR | S_IXGRP | S_IXOTH)) != 0;
#endif
}